

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<InternalHashToName>::Append
          (ON_SimpleArray<InternalHashToName> *this,InternalHashToName *x)

{
  ON__UINT8 *pOVar1;
  int iVar2;
  InternalHashToName *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  wchar_t *pwVar6;
  InternalHashToName *memblock;
  int iVar7;
  uint uVar8;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if (iVar2 < 8 || (ulong)((long)iVar2 << 5) < 0x10000001) {
      uVar8 = 4;
      if (2 < iVar2) {
        uVar8 = iVar2 * 2;
      }
    }
    else {
      iVar7 = 0x800008;
      if (iVar2 < 0x800008) {
        iVar7 = iVar2;
      }
      uVar8 = iVar7 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (InternalHashToName *)onmalloc(0x20);
      uVar4 = *(undefined8 *)((x->m_dirty_name_hash).m_digest + 8);
      uVar5 = *(undefined8 *)((x->m_dirty_name_hash).m_digest + 0x10);
      pwVar6 = x->m_family_name;
      *(undefined8 *)(memblock->m_dirty_name_hash).m_digest =
           *(undefined8 *)(x->m_dirty_name_hash).m_digest;
      *(undefined8 *)((memblock->m_dirty_name_hash).m_digest + 8) = uVar4;
      *(undefined8 *)((memblock->m_dirty_name_hash).m_digest + 0x10) = uVar5;
      memblock->m_family_name = pwVar6;
    }
    if ((uint)this->m_capacity < uVar8) {
      SetCapacity(this,(long)(int)uVar8);
    }
    if (this->m_a == (InternalHashToName *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pIVar3 = this->m_a;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  uVar4 = *(undefined8 *)(memblock->m_dirty_name_hash).m_digest;
  uVar5 = *(undefined8 *)((memblock->m_dirty_name_hash).m_digest + 8);
  pwVar6 = memblock->m_family_name;
  pOVar1 = pIVar3[iVar2].m_dirty_name_hash.m_digest + 0x10;
  *(undefined8 *)pOVar1 = *(undefined8 *)((memblock->m_dirty_name_hash).m_digest + 0x10);
  *(wchar_t **)(pOVar1 + 8) = pwVar6;
  pIVar3 = pIVar3 + iVar2;
  *(undefined8 *)(pIVar3->m_dirty_name_hash).m_digest = uVar4;
  *(undefined8 *)((pIVar3->m_dirty_name_hash).m_digest + 8) = uVar5;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}